

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (quadratic_cost_type<long_double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  longdouble lVar1;
  longdouble p2y;
  int iVar2;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  _Var3;
  pointer ppVar4;
  bool bVar5;
  type piVar6;
  type plVar7;
  reference pvVar8;
  iterator iVar9;
  difference_type dVar10;
  baryonyx *this_00;
  pointer ppVar11;
  iterator iVar12;
  long in_RCX;
  long in_R8;
  longdouble in_ST0;
  int local_170;
  int i_1;
  longdouble value;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  local_108;
  pair<long_double,_int> *local_100;
  pair<long_double,_int> *local_f8;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  local_f0;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  local_e8;
  pair<long_double,_int> *local_e0;
  pair<long_double,_int> *local_d8;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  local_d0;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  local_c8;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  next;
  iterator end;
  iterator begin;
  pair<long_double,_int> local_98;
  int local_70;
  allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_> local_69;
  int i;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  q;
  allocator<std::pair<long_double,_int>_> local_39;
  undefined1 local_38 [8];
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> r;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng_local;
  int n_local;
  quadratic_cost_type<long_double> *this_local;
  
  r.super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)rng;
  std::allocator<std::pair<long_double,_int>_>::allocator(&local_39);
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::vector
            ((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *)
             local_38,(long)n,&local_39);
  std::allocator<std::pair<long_double,_int>_>::~allocator(&local_39);
  piVar6 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n);
  iVar2 = *piVar6;
  std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>::allocator
            (&local_69);
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  ::vector((vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
            *)&i,(long)iVar2,&local_69);
  std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>::~allocator
            (&local_69);
  for (local_70 = 0; local_70 != n; local_70 = local_70 + 1) {
    plVar7 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       (&this->linear_elements,(long)local_70);
    std::pair<long_double,_int>::pair<long_double_&,_int_&,_true>(&local_98,plVar7,&local_70);
    pvVar8 = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ::operator[]((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                           *)local_38,(long)local_70);
    std::pair<long_double,_int>::operator=(pvVar8,&local_98);
  }
  iVar9 = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
          begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                 *)local_38);
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::end
            ((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *)
             local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar9._M_current);
  end = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
        begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *)
              local_38);
  next._M_current =
       (pair<long_double,_int> *)
       std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::end
                 ((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                   *)local_38);
  local_d0._M_current =
       (pair<long_double,_int> *)
       std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
       begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *)
             local_38);
  local_c8 = __gnu_cxx::
             __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
             ::operator++(&local_d0,0);
  while (bVar5 = __gnu_cxx::
                 operator==<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                           (&local_c8,&next), ((bVar5 ^ 0xffU) & 1) != 0) {
    ppVar11 = __gnu_cxx::
              __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
              ::operator->(&local_c8);
    lVar1 = ppVar11->first;
    ppVar11 = __gnu_cxx::
              __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
              ::operator->(&end);
    if ((lVar1 != ppVar11->first) || (NAN(lVar1) || NAN(ppVar11->first))) {
      local_d8 = end._M_current;
      local_e0 = local_c8._M_current;
      dVar10 = std::
               distance<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                         ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                           )end._M_current,local_c8);
      ppVar4 = r.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (1 < dVar10) {
        local_e8._M_current = end._M_current;
        local_f0._M_current = local_c8._M_current;
        ppVar11 = __gnu_cxx::
                  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                  ::operator->(&end);
        lVar1 = ppVar11->first;
        ppVar11 = __gnu_cxx::
                  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                  ::operator->(&local_c8);
        random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                  (local_e8,local_f0,(random_engine *)ppVar4,lVar1,ppVar11->first);
      }
      end._M_current = local_c8._M_current;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
    ::operator++(&local_c8);
  }
  local_f8 = end._M_current;
  local_100 = next._M_current;
  dVar10 = std::
           distance<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                     ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                       )end._M_current,next);
  if (1 < dVar10) {
    local_108._M_current =
         (pair<long_double,_int> *)
         std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
         begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *
               )local_38);
    bVar5 = __gnu_cxx::
            operator==<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                      (&end,&local_108);
    ppVar4 = r.
             super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar9 = end;
    _Var3 = next;
    if (bVar5) {
      ppVar11 = __gnu_cxx::
                __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                ::operator->(&end);
      lVar1 = ppVar11->first;
      ppVar11 = __gnu_cxx::
                __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                ::operator->(&end);
      random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                  )iVar9._M_current,_Var3,(random_engine *)ppVar4,lVar1,
                 (longdouble)1 + ppVar11->first);
    }
    else {
      pvVar8 = std::
               vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
               front((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                      *)local_38);
      lVar1 = pvVar8->first;
      iVar9 = std::
              vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
              begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                     *)local_38);
      this_00 = (baryonyx *)
                std::
                distance<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                          ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                            )iVar9._M_current,
                           (__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                            )end._M_current);
      ppVar11 = __gnu_cxx::
                __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                ::operator->(&end);
      p2y = ppVar11->first;
      iVar9 = std::
              vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
              begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                     *)local_38);
      iVar12 = std::
               vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
               end((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                    *)local_38);
      dVar10 = std::
               distance<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                         ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                           )iVar9._M_current,
                          (__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                           )iVar12._M_current);
      linearize<long,long_double>((longdouble *)0x0,this_00,dVar10,lVar1,in_RCX,p2y,in_R8);
      ppVar4 = r.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar9 = end;
      _Var3 = next;
      ppVar11 = __gnu_cxx::
                __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                ::operator->(&end);
      random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                  )iVar9._M_current,_Var3,(random_engine *)ppVar4,ppVar11->first,in_ST0);
    }
  }
  iVar9 = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
          begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                 *)local_38);
  iVar12 = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
           end((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *
               )local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>
            (iVar9._M_current,iVar12._M_current);
  for (local_170 = 0; local_170 != n; local_170 = local_170 + 1) {
    pvVar8 = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ::operator[]((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                           *)local_38,(long)local_170);
    lVar1 = pvVar8->first;
    plVar7 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       (&this->linear_elements,(long)local_170);
    *plVar7 = lVar1;
  }
  make_loo_norm(this,n);
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  ::~vector((vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
             *)&i);
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::~vector
            ((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *)
             local_38);
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);
        std::vector<std::pair<quad, int>> q(indices[n]);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        {
            auto begin = r.begin();
            auto end = r.end();
            auto next = r.begin()++;
            for (; next != end; ++next) {
                if (next->first != begin->first) {
                    if (std::distance(begin, next) > 1)
                        random_epsilon_unique(
                          begin, next, rng, begin->first, next->first);

                    begin = next;
                }
            }

            if (std::distance(begin, end) > 1) {
                if (begin == r.begin()) {
                    random_epsilon_unique(
                      begin, end, rng, begin->first, begin->first + 1);
                } else {
                    auto value = linearize(std::ptrdiff_t(0),
                                           r.front().first,
                                           std::distance(r.begin(), begin),
                                           begin->first,
                                           std::distance(r.begin(), r.end()));

                    random_epsilon_unique(
                      begin, end, rng, begin->first, value);
                }
            }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            std::sort(
              r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
                  return lhs.second < rhs.second;
              });
        }

        {
            // auto begin = q.begin();
            // auto end = q.end();
            // auto next = q.begin()++;
            // for (; next != end; ++next) {
            //     if (next->first != begin->first) {
            //         if (std::distance(begin, next) > 1)
            //             random_epsilon_unique(
            //               begin, next, rng, begin->first,
            //               next->first);

            //         begin = next;
            //     }
            // }

            // if (std::distance(begin, end) > 1) {
            //     if (begin == q.begin()) {
            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, begin->first +
            //           1);
            //     } else {
            //         auto value = linearize(std::ptrdiff_t(0),
            //                                q.front().first,
            //                                std::distance(q.begin(),
            //                                begin), begin->first,
            //                                std::distance(q.begin(),
            //                                q.end()));

            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, value);
            //     }
            // }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            // std::sort(
            //   q.begin(), q.end(), [](const auto& lhs, const auto&
            //   rhs) {
            //       return lhs.second < rhs.second;
            //   });
        }

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;
        // for (int i = 0; i != n; ++i) {
        //     quadratic_elements[i].factor = r[i].first.factor;

        // Finally we compute the l+oo norm.
        make_loo_norm(n);
    }